

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaching-definitions-transfer-function.h
# Opt level: O0

vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *
wasm::analysis::ReachingDefinitionsTransferFunction::listLocalSets
          (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *__return_storage_ptr__,
          Function *func,
          vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_> *fakeInitialValueSets,
          unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
          *fakeSetPtrs)

{
  ulong uVar1;
  size_type sVar2;
  reference local_98 [3];
  reference local_80;
  ulong local_78;
  size_t i_1;
  undefined1 local_68 [8];
  FindAll<wasm::LocalSet> setFinder;
  LocalSet currSet;
  Index i;
  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  *fakeSetPtrs_local;
  vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_> *fakeInitialValueSets_local;
  Function *func_local;
  vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setsList;
  
  for (currSet.value._4_4_ = 0; uVar1 = wasm::Function::getNumLocals(), currSet.value._4_4_ < uVar1;
      currSet.value._4_4_ = currSet.value._4_4_ + 1) {
    LocalSet::LocalSet((LocalSet *)
                       &setFinder.list.
                        super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>::push_back
              (fakeInitialValueSets,
               (value_type *)
               &setFinder.list.
                super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)local_68,func->body);
  i_1._7_1_ = 0;
  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::vector
            (__return_storage_ptr__,
             (vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)local_68);
  for (local_78 = 0; uVar1 = local_78,
      sVar2 = std::vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>::size
                        (fakeInitialValueSets), uVar1 < sVar2; local_78 = local_78 + 1) {
    local_80 = std::vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>::operator[]
                         (fakeInitialValueSets,local_78);
    std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
              (__return_storage_ptr__,&local_80);
    local_98[0] = std::vector<wasm::LocalSet,_std::allocator<wasm::LocalSet>_>::operator[]
                            (fakeInitialValueSets,local_78);
    std::
    unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
    ::insert(fakeSetPtrs,local_98);
  }
  i_1._7_1_ = 1;
  FindAll<wasm::LocalSet>::~FindAll((FindAll<wasm::LocalSet> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<LocalSet*>
  listLocalSets(Function* func,
                std::vector<LocalSet>& fakeInitialValueSets,
                std::unordered_set<LocalSet*>& fakeSetPtrs) {
    // Create a fictitious LocalSet for each local index.
    for (Index i = 0; i < func->getNumLocals(); ++i) {
      LocalSet currSet;
      currSet.index = i;
      fakeInitialValueSets.push_back(currSet);
    }

    // Find all actual LocalSets.
    FindAll<LocalSet> setFinder(func->body);
    std::vector<LocalSet*> setsList = std::move(setFinder.list);

    // Take a pointer for each fictitious LocalSet.
    for (size_t i = 0; i < fakeInitialValueSets.size(); ++i) {
      setsList.push_back(&fakeInitialValueSets[i]);
      fakeSetPtrs.insert(&fakeInitialValueSets[i]);
    }
    return setsList;
  }